

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwards.h
# Opt level: O0

void __thiscall
miniros::SubscriberCallbacks::SubscriberCallbacks
          (SubscriberCallbacks *this,SubscriberStatusCallback *connect,
          SubscriberStatusCallback *disconnect,VoidConstPtr *tracked_object,
          CallbackQueueInterface *callback_queue)

{
  bool bVar1;
  __shared_ptr *in_RCX;
  shared_ptr<const_void> *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  shared_ptr<const_void> *this_00;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffffc8;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::weak_ptr<const_void>::weak_ptr((weak_ptr<const_void> *)0x47fb2a);
  in_RDI[5].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_R8;
  *(undefined1 *)&in_RDI[4].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    *(undefined1 *)&in_RDI[4].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
    std::weak_ptr<void_const>::operator=((weak_ptr<const_void> *)this_00,in_RDI);
  }
  return;
}

Assistant:

SubscriberCallbacks(const SubscriberStatusCallback& connect = SubscriberStatusCallback(),
                      const SubscriberStatusCallback& disconnect = SubscriberStatusCallback(),
                      const VoidConstPtr& tracked_object = VoidConstPtr(),
                      CallbackQueueInterface* callback_queue = 0)
  : connect_(connect)
  , disconnect_(disconnect)
  , callback_queue_(callback_queue)
  {
    has_tracked_object_ = false;
    if (tracked_object)
    {
      has_tracked_object_ = true;
      tracked_object_ = tracked_object;
    }
  }